

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O2

void isoent_setup_directory_location(iso9660_conflict *iso9660,int location,vdd *vdd)

{
  isoent **ppiVar1;
  isofile *piVar2;
  content_conflict *pcVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  isoent *piVar7;
  long lVar8;
  extr_rec *peVar9;
  int iVar10;
  int iVar11;
  isofile *piVar12;
  isoent *isoent;
  
  vdd->total_dir_block = 0;
  iVar11 = 0;
  isoent = vdd->rootent;
  do {
    iVar10 = 1;
    iVar4 = get_dir_rec_size(iso9660,isoent,DIR_REC_SELF,vdd->vdd_type);
    iVar5 = get_dir_rec_size(iso9660,isoent,DIR_REC_PARENT,vdd->vdd_type);
    iVar6 = (isoent->children).cnt;
    if ((0 < iVar6) &&
       (((vdd->vdd_type == VDD_JOLIET || ((*(ushort *)&(iso9660->opt).field_0x2 & 0x180) != 0)) ||
        (iVar10 = 1, iVar11 + 1 < vdd->max_depth)))) {
      iVar5 = iVar5 + iVar4;
      ppiVar1 = isoent->children_sorted;
      iVar10 = 1;
      for (lVar8 = 0; lVar8 < iVar6; lVar8 = lVar8 + 1) {
        piVar7 = ppiVar1[lVar8];
        piVar2 = piVar7->file;
        piVar12 = piVar2->hardlink_target;
        if (piVar12 == (isofile *)0x0) {
          piVar12 = piVar2;
        }
        piVar12->cur_content = &piVar12->content;
        do {
          iVar6 = get_dir_rec_size(iso9660,piVar7,DIR_REC_NORMAL,vdd->vdd_type);
          iVar4 = iVar5 + iVar6;
          iVar5 = iVar4;
          if (0x800 < iVar4) {
            iVar5 = iVar6;
          }
          iVar10 = iVar10 + (uint)(0x800 < iVar4);
          pcVar3 = piVar12->cur_content->next;
          piVar12->cur_content = pcVar3;
        } while (pcVar3 != (content_conflict *)0x0);
        iVar6 = (isoent->children).cnt;
      }
    }
    isoent->dir_block = iVar10;
    iVar6 = vdd->total_dir_block + iVar10;
    isoent->dir_location = location;
    location = location + iVar10;
    peVar9 = (isoent->extr_rec_list).first;
    (isoent->extr_rec_list).current = peVar9;
    for (; peVar9 != (extr_rec *)0x0; peVar9 = peVar9->next) {
      peVar9->location = location;
      peVar9->offset = 0;
      location = location + 1;
      iVar6 = iVar6 + 1;
    }
    vdd->total_dir_block = iVar6;
    piVar7 = (isoent->subdirs).first;
    if ((piVar7 == (isoent *)0x0) || (iVar6 = iVar11 + 1, vdd->max_depth <= iVar11 + 1)) {
      while ((piVar7 = isoent, ppiVar1 = &piVar7->parent, iVar6 = iVar11, piVar7 != *ppiVar1 &&
             (piVar7 = piVar7->drnext, piVar7 == (isoent *)0x0))) {
        iVar11 = iVar11 + -1;
        isoent = *ppiVar1;
      }
    }
    iVar11 = iVar6;
    isoent = piVar7;
  } while (piVar7 != piVar7->parent);
  return;
}

Assistant:

static void
isoent_setup_directory_location(struct iso9660 *iso9660, int location,
    struct vdd *vdd)
{
	struct isoent *np;
	int depth;

	vdd->total_dir_block = 0;
	depth = 0;
	np = vdd->rootent;
	do {
		int block;

		np->dir_block = calculate_directory_descriptors(
		    iso9660, vdd, np, depth);
		vdd->total_dir_block += np->dir_block;
		np->dir_location = location;
		location += np->dir_block;
		block = extra_setup_location(np, location);
		vdd->total_dir_block += block;
		location += block;

		if (np->subdirs.first != NULL && depth + 1 < vdd->max_depth) {
			/* Enter to sub directories. */
			np = np->subdirs.first;
			depth++;
			continue;
		}
		while (np != np->parent) {
			if (np->drnext == NULL) {
				/* Return to the parent directory. */
				np = np->parent;
				depth--;
			} else {
				np = np->drnext;
				break;
			}
		}
	} while (np != np->parent);
}